

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionModel.cpp
# Opt level: O2

bool __thiscall
chrono::collision::ChCollisionModel::AddConvexHullsFromFile
          (ChCollisionModel *this,shared_ptr<chrono::ChMaterialSurface> *material,
          ChStreamInAscii *mstream,ChVector<double> *pos,ChMatrix33<double> *rot)

{
  char cVar1;
  undefined1 auVar2 [16];
  int iVar3;
  ChException *this_00;
  long lVar4;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> ptlist;
  float vz;
  float vy;
  float vx;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> *local_178;
  ChCollisionModel *local_170;
  ChVector<double> *local_168;
  ChMatrix33<double> *local_160;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_158;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_148;
  ChVector<double> local_138;
  string local_118;
  char bufdata [200];
  
  ptlist.super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ptlist.super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ptlist.super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178 = &material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>;
  local_170 = this;
  local_168 = pos;
  local_160 = rot;
  do {
    iVar3 = (*(mstream->super_ChStreamIn)._vptr_ChStreamIn[2])(mstream);
    if ((char)iVar3 != '\0') {
      if (ptlist.
          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          ptlist.
          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_158,local_178);
        (*local_170->_vptr_ChCollisionModel[0xf])(local_170,&local_158,&ptlist,local_168,local_160);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_158._M_refcount);
      }
      if (ptlist.
          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          ptlist.
          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        ptlist.
        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             ptlist.
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      }
      std::_Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::
      ~_Vector_base(&ptlist.
                     super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                   );
      return true;
    }
    lVar4 = 0;
    while( true ) {
      iVar3 = (*(mstream->super_ChStreamIn)._vptr_ChStreamIn[2])(mstream);
      if ((char)iVar3 != '\0') break;
      (*(mstream->super_ChStreamIn)._vptr_ChStreamIn[5])(mstream,bufdata + lVar4);
      cVar1 = bufdata[lVar4];
      if ((cVar1 == '\r') || (cVar1 == '\n')) {
        bufdata[lVar4] = '\0';
        break;
      }
      lVar4 = lVar4 + 1;
      if (lVar4 == 200) {
        this_00 = (ChException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&local_118,"Too long line in parsing",(allocator *)&local_138);
        ChException::ChException(this_00,&local_118);
        __cxa_throw(this_00,&ChException::typeinfo,ChException::~ChException);
      }
    }
    bufdata[lVar4 + 1] = '\0';
    iVar3 = bcmp(bufdata,"hull",5);
    if (iVar3 == 0) {
      if (ptlist.
          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          ptlist.
          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_148,local_178);
        (*local_170->_vptr_ChCollisionModel[0xf])(local_170,&local_148,&ptlist,local_168,local_160);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_148._M_refcount);
      }
      if (ptlist.
          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          ptlist.
          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        ptlist.
        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             ptlist.
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      }
    }
    iVar3 = __isoc99_sscanf(bufdata,"%g %g %g",&vx,&vy,&vz);
    if (iVar3 == 3) {
      local_138.m_data[2] = (double)vz;
      auVar2 = vinsertps_avx(ZEXT416((uint)vx),ZEXT416((uint)vy),0x10);
      local_138.m_data._0_16_ = vcvtps2pd_avx(auVar2);
      std::vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>>::
      emplace_back<chrono::ChVector<double>>
                ((vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>> *)
                 &ptlist,&local_138);
    }
  } while( true );
}

Assistant:

bool ChCollisionModel::AddConvexHullsFromFile(std::shared_ptr<ChMaterialSurface> material,
                                              ChStreamInAscii& mstream,
                                              const ChVector<>& pos,
                                              const ChMatrix33<>& rot) {
    std::vector<ChVector<double> > ptlist;

    char bufdata[200];
    int linechar = 0;
    while (!mstream.End_of_stream()) {
        // read one line
        linechar = 0;
        while (!mstream.End_of_stream()) {
            try {
                mstream >> bufdata[linechar];
            } catch (const ChException &) {
            };
            if ((bufdata[linechar] == (char)13) || (bufdata[linechar] == (char)10)) {
                bufdata[linechar] = 0;
                break;
            }
            linechar++;
            if (linechar >= 200)
                throw(ChException("Too long line in parsing"));
        }
        bufdata[linechar + 1] = 0;

        ////bool parsedline = false;
        if (bufdata[0] != *"#") {
            ////parsedline = true;
        }
        if (strcmp(bufdata, "hull") == 0) {
            if (ptlist.size())
                this->AddConvexHull(material, ptlist, pos, rot);
            ptlist.clear();
            ////parsedline = true;
        }
        float vx, vy, vz;
        if (sscanf(bufdata, "%g %g %g", &vx, &vy, &vz) == 3) {
            ptlist.push_back(ChVector<>(vx, vy, vz));
            ////parsedline = true;
        }
    }
    
    if (ptlist.size())
        this->AddConvexHull(material, ptlist, pos, rot);
    ptlist.clear();

    return true;
}